

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::GenerateCommonBuilderMethods
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  string local_30;
  
  ClassNameResolver::GetClassName_abi_cxx11_(&local_30,this->name_resolver_,this->descriptor_,true);
  io::Printer::Print(printer,
                     "// Construct using $classname$.newBuilder()\nprivate Builder() {\n  super(DEFAULT_INSTANCE);\n}\n\n"
                     ,"classname",&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageBuilderLiteGenerator::
GenerateCommonBuilderMethods(io::Printer* printer) {
  printer->Print(
    "// Construct using $classname$.newBuilder()\n"
    "private Builder() {\n"
    "  super(DEFAULT_INSTANCE);\n"
    "}\n"
    "\n",
    "classname", name_resolver_->GetImmutableClassName(descriptor_));
}